

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DetectModule(char *input,size_t input_len)

{
  int iVar1;
  uint8_t **in_RSI;
  undefined8 in_RDI;
  int tok;
  uint8_t *p;
  bool local_29;
  BOOL no_line_terminator;
  uint local_4;
  
  no_line_terminator = (BOOL)((ulong)in_RDI >> 0x20);
  iVar1 = simple_next_token(in_RSI,no_line_terminator);
  if (iVar1 == -0x35) {
    local_4 = 1;
  }
  else if (iVar1 == -0x33) {
    iVar1 = simple_next_token(in_RSI,no_line_terminator);
    local_29 = iVar1 != 0x2e && iVar1 != 0x28;
    local_4 = (uint)local_29;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BOOL JS_DetectModule(const char *input, size_t input_len)
{
    const uint8_t *p = (const uint8_t *)input;
    int tok;
    switch(simple_next_token(&p, FALSE)) {
    case TOK_IMPORT:
        tok = simple_next_token(&p, FALSE);
        return (tok != '.' && tok != '(');
    case TOK_EXPORT:
        return TRUE;
    default:
        return FALSE;
    }
}